

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O2

psa_status_t
psa_its_set(psa_storage_uid_t uid,uint32_t data_length,void *p_data,
           psa_storage_create_flags_t create_flags)

{
  bool bVar1;
  int iVar2;
  FILE *__s;
  size_t sVar3;
  psa_status_t pVar4;
  psa_status_t pVar5;
  psa_its_file_header_t header;
  char filename [25];
  
  builtin_memcpy(header.magic,"PSA",4);
  builtin_memcpy(header.magic + 4,"ITS",4);
  header.size[0] = (uint8_t)data_length;
  header.size[1] = (uint8_t)(data_length >> 8);
  header.size[2] = (uint8_t)(data_length >> 0x10);
  header.size[3] = (uint8_t)(data_length >> 0x18);
  header.flags[0] = (uint8_t)create_flags;
  header.flags[1] = (uint8_t)(create_flags >> 8);
  header.flags[2] = (uint8_t)(create_flags >> 0x10);
  header.flags[3] = (uint8_t)(create_flags >> 0x18);
  psa_its_fill_filename(uid,filename);
  __s = fopen("tempfile.psa_its","wb");
  if (__s == (FILE *)0x0) {
    pVar4 = -0x92;
  }
  else {
    sVar3 = fwrite(&header,1,0x10,__s);
    if ((sVar3 == 0x10) &&
       ((data_length == 0 || (sVar3 = fwrite(p_data,1,(ulong)data_length,__s), sVar3 == data_length)
        ))) {
      pVar5 = 0;
      bVar1 = true;
    }
    else {
      bVar1 = false;
      pVar5 = -0x8e;
    }
    iVar2 = fclose(__s);
    pVar4 = -0x8e;
    if (iVar2 == 0) {
      pVar4 = pVar5;
    }
    if (!bVar1) {
      pVar4 = pVar5;
    }
    if (iVar2 == 0 && bVar1) {
      iVar2 = rename("tempfile.psa_its",filename);
      pVar4 = -0x92;
      if (iVar2 == 0) {
        pVar4 = 0;
      }
    }
  }
  remove("tempfile.psa_its");
  return pVar4;
}

Assistant:

psa_status_t psa_its_set( psa_storage_uid_t uid,
                          uint32_t data_length,
                          const void *p_data,
                          psa_storage_create_flags_t create_flags )
{
    psa_status_t status = PSA_ERROR_STORAGE_FAILURE;
    char filename[PSA_ITS_STORAGE_FILENAME_LENGTH];
    FILE *stream = NULL;
    psa_its_file_header_t header;
    size_t n;

    memcpy( header.magic, PSA_ITS_MAGIC_STRING, PSA_ITS_MAGIC_LENGTH );
    header.size[0] = data_length & 0xff;
    header.size[1] = ( data_length >> 8 ) & 0xff;
    header.size[2] = ( data_length >> 16 ) & 0xff;
    header.size[3] = ( data_length >> 24 ) & 0xff;
    header.flags[0] = create_flags & 0xff;
    header.flags[1] = ( create_flags >> 8 ) & 0xff;
    header.flags[2] = ( create_flags >> 16 ) & 0xff;
    header.flags[3] = ( create_flags >> 24 ) & 0xff;

    psa_its_fill_filename( uid, filename );
    stream = fopen( PSA_ITS_STORAGE_TEMP, "wb" );
    if( stream == NULL )
        goto exit;

    status = PSA_ERROR_INSUFFICIENT_STORAGE;
    n = fwrite( &header, 1, sizeof( header ), stream );
    if( n != sizeof( header ) )
        goto exit;
    if( data_length != 0 )
    {
        n = fwrite( p_data, 1, data_length, stream );
        if( n != data_length )
            goto exit;
    }
    status = PSA_SUCCESS;

exit:
    if( stream != NULL )
    {
        int ret = fclose( stream );
        if( status == PSA_SUCCESS && ret != 0 )
            status = PSA_ERROR_INSUFFICIENT_STORAGE;
    }
    if( status == PSA_SUCCESS )
    {
        if( rename_replace_existing( PSA_ITS_STORAGE_TEMP, filename ) != 0 )
            status = PSA_ERROR_STORAGE_FAILURE;
    }
    remove( PSA_ITS_STORAGE_TEMP );
    return( status );
}